

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void readTiledRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  int dxMin;
  int dyMin;
  int dxMax;
  TiledRgbaInputFile *this;
  int *in_RCX;
  int *in_RDX;
  Array2D<Imf_2_5::Rgba> *in_RSI;
  int dy;
  int dx;
  Box2i dw;
  TiledRgbaInputFile in;
  size_t in_stack_00000128;
  size_t in_stack_00000130;
  Rgba *in_stack_00000138;
  TiledRgbaInputFile *in_stack_00000140;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  long in_stack_ffffffffffffffa8;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffffb0;
  
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
            ((TiledRgbaInputFile *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff94);
  Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)0x1187b9);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  *in_RDX = (in_stack_ffffffffffffffa0 - in_stack_ffffffffffffff98) + 1;
  *in_RCX = (in_stack_ffffffffffffffa4 - in_stack_ffffffffffffff9c) + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  this = (TiledRgbaInputFile *)
         Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RSI,(long)-in_stack_ffffffffffffff9c);
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
  dxMin = Imf_2_5::TiledRgbaInputFile::numXTiles
                    ((TiledRgbaInputFile *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
  dyMin = dxMin + -1;
  dxMax = Imf_2_5::TiledRgbaInputFile::numYTiles
                    ((TiledRgbaInputFile *)CONCAT44(dyMin,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
  Imf_2_5::TiledRgbaInputFile::readTiles
            (this,dxMin,dxMax,dyMin,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile(this);
  return;
}

Assistant:

void
readTiledRgba1 (const char fileName[],
                Array2D<Rgba> &pixels,
                int &width,
                int &height)
{
    TiledRgbaInputFile in (fileName);
    Box2i dw = in.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
}